

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_etc.c
# Opt level: O0

int zzJacobi(word *a,size_t n,word *b,size_t m,void *stack)

{
  int iVar1;
  bool_t bVar2;
  word *b_00;
  size_t sVar3;
  size_t in_RCX;
  word *in_RDX;
  long in_RSI;
  void *in_RDI;
  word *in_R8;
  word *v;
  word *u;
  size_t s;
  word *in_stack_00000018;
  int t;
  size_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar4;
  word *a_00;
  size_t local_10;
  
  iVar4 = 1;
  b_00 = in_R8 + in_RSI;
  a_00 = b_00 + in_RCX;
  wwCopy(b_00,in_RDX,in_RCX);
  sVar3 = wwWordSize(b_00,in_RCX);
  zzMod((word *)stack,in_stack_00000018,s,u,(size_t)v,in_RDI);
  local_10 = wwWordSize(in_R8,sVar3);
  while( true ) {
    iVar1 = wwCmpW((word *)CONCAT44(iVar4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
                   (word)in_R8);
    if (iVar1 < 1) {
      return iVar4;
    }
    bVar2 = wwIsZero(in_R8,local_10);
    if (bVar2 != 0) break;
    bVar2 = wwIsW(in_R8,local_10,1);
    if (bVar2 != 0) {
      return iVar4;
    }
    sVar3 = wwLoZeroBits(a_00,CONCAT44(iVar4,in_stack_ffffffffffffffd0));
    if (((sVar3 & 1) != 0) && (((*b_00 & 7) == 3 || ((*b_00 & 7) == 5)))) {
      iVar4 = -iVar4;
    }
    wwShLo((word *)CONCAT44(iVar4,in_stack_ffffffffffffffd0),sVar3,(size_t)in_R8);
    sVar3 = wwWordSize(in_R8,local_10);
    if (((*in_R8 & 3) == 3) && ((*b_00 & 3) == 3)) {
      iVar4 = -iVar4;
    }
    zzMod((word *)stack,in_stack_00000018,s,u,(size_t)v,in_RDI);
    in_stack_ffffffffffffffc8 = wwWordSize(b_00,sVar3);
    wwSwap(in_R8,b_00,sVar3);
    local_10 = in_stack_ffffffffffffffc8;
  }
  return 0;
}

Assistant:

int zzJacobi(const word a[], size_t n, const word b[], size_t m, void* stack)
{
	register int t = 1;
	register size_t s;
	// переменные в stack
	word* u = (word*)stack;
	word* v = u + n;
	stack = v + m;
	// pre
	ASSERT(wwIsValid(a, n));
	ASSERT(zzIsOdd(b, m));
	// v <- b
	wwCopy(v, b, m);
	m = wwWordSize(v, m);
	// u <- a \mod b
	zzMod(u, a, n, v, m, stack);
	n = wwWordSize(u, m);
	// основной цикл
	while (wwCmpW(v, m, 1) > 0)
	{
		// u == 0 => (u / v) <- 0
		if (wwIsZero(u, n))
		{
			t = 0;
			break;
		}
		// u == 1 => (u / v) <- s
		if (wwIsW(u, n, 1))
			break;
		// s <- max_{2^i | u}i
		s = wwLoZeroBits(u, n);
		// s -- нечетное, v \equiv 3, 5 \mod 8 => t <- -t
		if (s % 2 && ((v[0] & 7) == 3 || (v[0] & 7) == 5))
			t = -t;
		// u <- u / 2^s
		wwShLo(u, n, s);
		n = wwWordSize(u, n);
		// u, v \equiv 3 \mod 4 => t <- -t
		if ((u[0] & 3) == 3 && (v[0] & 3) == 3)
			t = -t;
		// v <- v \mod u
		zzMod(v, v, m, u, n, stack);
		m = wwWordSize(v, n);
		// v <-> u
		wwSwap(u, v, n);
		s = m, m = n, n = s;
	}
	// символ Якоби
	return t;
}